

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall tchecker::ta::system_t::system_t(system_t *this,system_t *system)

{
  system_t *psVar1;
  system_t *system_local;
  system_t *this_local;
  
  psVar1 = as_syncprod_system(system);
  syncprod::system_t::system_t(&this->super_system_t,psVar1);
  vm_t::vm_t(&this->_vm,&system->_vm);
  std::
  vector<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
  ::vector(&this->_invariants);
  std::
  vector<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
  ::vector(&this->_guards);
  std::
  vector<tchecker::ta::system_t::compiled_statement_t,_std::allocator<tchecker::ta::system_t::compiled_statement_t>_>
  ::vector(&this->_statements);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&this->_urgent);
  compute_from_syncprod_system(this);
  return;
}

Assistant:

system_t::system_t(tchecker::ta::system_t const & system)
    : tchecker::syncprod::system_t(system.as_syncprod_system()), _vm(system._vm)
{
  compute_from_syncprod_system();
}